

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void iterator_extreme_key_test(void)

{
  void *pvVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  char *__format;
  ulong keylen;
  fdb_iterator *fit;
  fdb_doc *doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config local_650;
  timeval __test_begin;
  char value [256];
  char key [256];
  fdb_config local_420;
  char valueBuf [256];
  char keyBuf [256];
  char cmd [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  doc = (fdb_doc *)0x0;
  builtin_strncpy(cmd,"rm -rf  iterator_test*",0x17);
  system(cmd);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fVar2 = fdb_open(&dbfile,"./iterator_test",&local_420);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x596);
    iterator_extreme_key_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x596,"void iterator_extreme_key_test()");
  }
  fVar2 = fdb_kvs_open(dbfile,&db,(char *)0x0,&local_650);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x598);
    iterator_extreme_key_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x598,"void iterator_extreme_key_test()");
  }
  memset(key,0xff,0x100);
  for (keylen = 1; keylen != 0x1e; keylen = keylen + 1) {
    sprintf(value,"0xff length %d",keylen & 0xffffffff);
    handle = db;
    sVar4 = strlen(value);
    fdb_set_kv(handle,key,keylen,value,sVar4 + 1);
  }
  fdb_commit(dbfile,'\x01');
  fVar2 = fdb_doc_create(&doc,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5a3);
    iterator_extreme_key_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x5a3,"void iterator_extreme_key_test()");
  }
  doc->key = keyBuf;
  doc->meta = (void *)0x0;
  doc->body = valueBuf;
  fVar2 = fdb_iterator_init(db,&fit,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5a9);
    iterator_extreme_key_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x5a9,"void iterator_extreme_key_test()");
  }
  fVar2 = fdb_iterator_seek_to_max(fit);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5ab);
    iterator_extreme_key_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x5ab,"void iterator_extreme_key_test()");
  }
  iVar5 = 0x1d;
  fVar2 = FDB_RESULT_SUCCESS;
  while (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_iterator_get(fit,&doc);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    sprintf(value,"0xff length %d",iVar5);
    pvVar1 = doc->body;
    iVar3 = bcmp(pvVar1,value,doc->bodylen);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",value,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x5b3);
      iterator_extreme_key_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5b3,"void iterator_extreme_key_test()");
    }
    fVar2 = fdb_iterator_prev(fit);
    iVar5 = iVar5 + -1;
  }
  fVar2 = fdb_iterator_seek(fit,key,8,'\x01');
  iVar5 = 8;
  while (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_iterator_get(fit,&doc);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    sprintf(value,"0xff length %d",iVar5);
    pvVar1 = doc->body;
    iVar3 = bcmp(pvVar1,value,doc->bodylen);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",value,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x5c1);
      iterator_extreme_key_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5c1,"void iterator_extreme_key_test()");
    }
    fVar2 = fdb_iterator_prev(fit);
    iVar5 = iVar5 + -1;
  }
  fVar2 = fdb_iterator_seek(fit,key,8,'\x01');
  iVar5 = 8;
  while (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_iterator_get(fit,&doc);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    sprintf(value,"0xff length %d",iVar5);
    pvVar1 = doc->body;
    iVar3 = bcmp(pvVar1,value,doc->bodylen);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",value,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x5cf);
      iterator_extreme_key_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5cf,"void iterator_extreme_key_test()");
    }
    fVar2 = fdb_iterator_next(fit);
    iVar5 = iVar5 + 1;
  }
  fVar2 = fdb_iterator_close(fit);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5d5);
    iterator_extreme_key_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x5d5,"void iterator_extreme_key_test()");
  }
  fVar2 = fdb_iterator_init(db,&fit,(void *)0x0,0,key,0x100,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5d9);
    iterator_extreme_key_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x5d9,"void iterator_extreme_key_test()");
  }
  fVar2 = fdb_iterator_seek_to_max(fit);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5db);
    iterator_extreme_key_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x5db,"void iterator_extreme_key_test()");
  }
  iVar5 = 0x1d;
  fVar2 = FDB_RESULT_SUCCESS;
  while (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_iterator_get(fit,&doc);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    sprintf(value,"0xff length %d",iVar5);
    pvVar1 = doc->body;
    iVar3 = bcmp(pvVar1,value,doc->bodylen);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",value,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x5e4);
      iterator_extreme_key_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x5e4,"void iterator_extreme_key_test()");
    }
    fVar2 = fdb_iterator_prev(fit);
    iVar5 = iVar5 + -1;
  }
  fVar2 = fdb_iterator_close(fit);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5ea);
    iterator_extreme_key_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x5ea,"void iterator_extreme_key_test()");
  }
  fVar2 = fdb_close(dbfile);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5ec);
    iterator_extreme_key_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x5ec,"void iterator_extreme_key_test()");
  }
  doc->key = (void *)0x0;
  doc->body = (void *)0x0;
  fVar2 = fdb_doc_free(doc);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x5f2);
    iterator_extreme_key_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x5f2,"void iterator_extreme_key_test()");
  }
  fVar2 = fdb_shutdown();
  if (fVar2 == FDB_RESULT_SUCCESS) {
    memleak_end();
    __format = "%s PASSED\n";
    if (iterator_extreme_key_test()::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"iterator extreme key test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0x5f5);
  iterator_extreme_key_test()::__test_pass = 1;
  __assert_fail("s == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x5f5,"void iterator_extreme_key_test()");
}

Assistant:

void iterator_extreme_key_test()
{
    TEST_INIT();

    int n = 30;
    int i, r, c;
    char cmd[256];
    char key[256], value[256];
    char keyBuf[256], valueBuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc = NULL;
    fdb_iterator *fit;
    fdb_status s;

    sprintf(cmd, SHELL_DEL " iterator_test*");
    r = system(cmd);
    (void)r;

    memleak_start();

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    s = fdb_open(&dbfile, "./iterator_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(key, 0xff, 256);
    for (i=1;i<n;i+=1){
        sprintf(value, "0xff length %d", (int)i);
        fdb_set_kv(db, key, i, value, strlen(value)+1);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // Pre-allocate iterator return document memory and re-use the same
    s = fdb_doc_create(&doc, NULL, 0, NULL, 0, NULL, 0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    doc->key = &keyBuf[0];
    doc->meta = NULL;
    doc->body = &valueBuf[0];

    s = fdb_iterator_init(db, &fit, NULL, 0, NULL, 0, 0x0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_iterator_seek_to_max(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    c = n-1;
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_prev(fit);
        c--;
    }

    i = 8;
    c = i;
    s = fdb_iterator_seek(fit, key, i, FDB_ITR_SEEK_LOWER);
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_prev(fit);
        c--;
    }

    i = 8;
    c = i;
    s = fdb_iterator_seek(fit, key, i, FDB_ITR_SEEK_LOWER);
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_next(fit);
        c++;
    }

    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // Initialize iterator to an extreme non-existent end_key
    s = fdb_iterator_init(db, &fit, NULL, 0, key, 256, 0x0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_iterator_seek_to_max(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    c = n-1;
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_prev(fit);
        c--;
    }

    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // Release pre-allocated iterator return document buffer space
    doc->key = NULL;
    doc->body = NULL;
    s = fdb_doc_free(doc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    memleak_end();
    TEST_RESULT("iterator extreme key test");
}